

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O3

float __thiscall sentencepiece::unigram::Lattice::CalculateEntropy(Lattice *this,float inv_theta)

{
  pointer ppNVar1;
  Node *pNVar2;
  Node *pNVar3;
  long lVar4;
  void *pvVar5;
  pointer pfVar6;
  ulong uVar7;
  const_iterator __end4;
  pointer ppNVar8;
  uint uVar9;
  float fVar10;
  vector<float,_std::allocator<float>_> H;
  vector<float,_std::allocator<float>_> alpha;
  allocator_type local_b9;
  pointer local_b8;
  pointer local_b0;
  pointer local_a8;
  vector<float,_std::allocator<float>_> local_a0;
  undefined1 local_88 [16];
  ulong local_70;
  pointer local_68;
  ulong local_60;
  ulong local_58;
  pointer local_50;
  vector<float,_std::allocator<float>_> local_48;
  
  uVar9 = (int)((ulong)((long)(this->surface_).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->surface_).
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3) - 1;
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_a0,
             (this->node_allocator_).chunk_index_ * (this->node_allocator_).chunk_size_ +
             (this->node_allocator_).element_index_,(value_type_conflict5 *)&local_48,&local_b9);
  ForwardAlgorithm(&local_48,this,inv_theta);
  local_b0 = (this->begin_nodes_).
             super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_68 = (this->end_nodes_).
             super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_60 = (ulong)(uVar9 + 1);
  uVar7 = 0;
  local_70 = (ulong)uVar9;
  do {
    pfVar6 = local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_b8 = local_b0[uVar7].
               super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_50 = *(pointer *)
                ((long)&local_b0[uVar7].
                        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                        ._M_impl.super__Vector_impl_data + 8);
    local_58 = uVar7;
    if (local_b8 != local_50) {
      local_a8 = local_68[uVar7].
                 super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppNVar1 = *(pointer *)
                 ((long)&local_68[uVar7].
                         super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                         ._M_impl.super__Vector_impl_data + 8);
      lVar4 = CONCAT44(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_);
      do {
        if (local_a8 != ppNVar1) {
          pNVar2 = *local_b8;
          uVar7 = (ulong)pNVar2->node_id;
          ppNVar8 = local_a8;
          do {
            pNVar3 = *ppNVar8;
            fVar10 = (pNVar3->score * inv_theta + *(float *)(lVar4 + (ulong)pNVar3->node_id * 4)) -
                     *(float *)(lVar4 + uVar7 * 4);
            local_88._0_4_ = fVar10;
            fVar10 = expf(fVar10);
            uVar7 = (ulong)pNVar2->node_id;
            pfVar6[uVar7] =
                 ((float)local_88._0_4_ + pfVar6[pNVar3->node_id]) * fVar10 + pfVar6[uVar7];
            ppNVar8 = ppNVar8 + 1;
          } while (ppNVar8 != ppNVar1);
        }
        local_b8 = local_b8 + 1;
      } while (local_b8 != local_50);
    }
    uVar7 = local_58 + 1;
  } while (uVar7 != local_60);
  local_88 = ZEXT416((uint)local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start
                           [*(uint *)(**(long **)&local_b0[local_70 & 0xffffffff].
                                                  super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                                                  ._M_impl.super__Vector_impl_data + 0x18)]);
  pvVar5 = (void *)CONCAT44(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
    if (local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) goto LAB_001f201a;
  }
  operator_delete(local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
LAB_001f201a:
  return -(float)local_88._0_4_;
}

Assistant:

float Lattice::CalculateEntropy(float inv_theta) const {
  const int len = size();

  // alpha[node_id] is the marginal prob of sequence up to start of node
  // H is entropy of sequence
  // the index of alpha/H is Node::node_id.
  std::vector<float> H(node_allocator_.size(), 0.0);

  // Populate the forward marginals to get the normalising constant
  const auto alpha = ForwardAlgorithm(inv_theta);

  // Now populate the forward entropies
  for (int pos = 0; pos <= len; ++pos) {
    for (Node *rnode : begin_nodes_[pos]) {
      for (Node *lnode : end_nodes_[pos]) {
        // Contribution each lnode makes = p(lnode) * (H(lnode) + log p(lnode))

        // We have to normalise p(lnode) by the marginal contribution it makes
        const float lnode_transition_prob =
            ((inv_theta * lnode->score) + alpha[lnode->node_id] -
             alpha[rnode->node_id]);
        H[rnode->node_id] += std::exp(lnode_transition_prob) *
                             (H[lnode->node_id] + lnode_transition_prob);
      }
    }
  }

  return -H[begin_nodes_[len][0]->node_id];
}